

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readModRM(InternalInstruction *insn)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  InternalInstruction *insn_00;
  undefined4 uVar7;
  long in_RDI;
  uint8_t reg;
  uint8_t rm;
  uint8_t mod;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  InternalInstruction *in_stack_ffffffffffffffd0;
  InternalInstruction *in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffec;
  
  if ((*(byte *)(in_RDI + 0x70) & 1) != 0) {
    return 0;
  }
  *(char *)(in_RDI + 0x98) =
       (char)*(undefined8 *)(in_RDI + 0xb0) - (char)*(undefined8 *)(in_RDI + 0xd0);
  iVar5 = consumeByte(in_stack_ffffffffffffffd0,
                      (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar5 != 0) {
    return -1;
  }
  *(undefined1 *)(in_RDI + 0x70) = 1;
  *(undefined1 *)(in_RDI + 0x71) = *(undefined1 *)(in_RDI + 0x110);
  if ((((*(char *)(in_RDI + 0x111) == '\x0f') && (*(int *)(in_RDI + 0xf8) == 1)) &&
      (0x1f < *(byte *)(in_RDI + 0xf5))) && (*(byte *)(in_RDI + 0xf5) < 0x24)) {
    *(byte *)(in_RDI + 0x110) = *(byte *)(in_RDI + 0x110) | 0xc0;
  }
  bVar2 = *(byte *)(in_RDI + 0x110) >> 6;
  uVar6 = (uint)*(byte *)(in_RDI + 0xf0);
  if (uVar6 == 2) {
    *(undefined4 *)(in_RDI + 0x134) = 0x14;
    *(undefined4 *)(in_RDI + 0x130) = 0x45;
  }
  else if (uVar6 == 4) {
    *(undefined4 *)(in_RDI + 0x134) = 0x24;
    *(undefined4 *)(in_RDI + 0x130) = 0x55;
  }
  else if (uVar6 == 8) {
    *(undefined4 *)(in_RDI + 0x134) = 0x34;
    *(undefined4 *)(in_RDI + 0x130) = 0x65;
  }
  bVar3 = (byte)((*(byte *)(in_RDI + 0x110) & 0x38) >> 3) |
          (byte)(((int)(*(byte *)(in_RDI + 0x68) & 4) >> 2) << 3);
  bVar4 = *(byte *)(in_RDI + 0x110) & 7 | (*(byte *)(in_RDI + 0x68) & 1) << 3;
  if (*(int *)(in_RDI + 0xe0) == 3) {
    bVar3 = bVar3 | (byte)(((int)((*(byte *)(in_RDI + 0x93) ^ 0xffffffff) & 0x10) >> 4) << 4);
    bVar4 = bVar4 | (byte)(((int)((*(byte *)(in_RDI + 0x93) ^ 0xffffffff) & 0x40) >> 6) << 4);
  }
  *(uint *)(in_RDI + 0x140) = *(int *)(in_RDI + 0x134) + (uint)bVar3;
  cVar1 = *(char *)(in_RDI + 0xf1);
  if (cVar1 == '\x02') {
    *(undefined4 *)(in_RDI + 300) = 1;
    insn_00 = (InternalInstruction *)(ulong)bVar2;
    switch(insn_00) {
    case (InternalInstruction *)0x0:
      goto switchD_00350ba9_caseD_0;
    case (InternalInstruction *)0x1:
      *(uint *)(in_RDI + 0x138) = *(int *)(in_RDI + 300) + (uint)bVar4;
      *(undefined4 *)(in_RDI + 0x13c) = 1;
      *(undefined1 *)(in_RDI + 0xf2) = 1;
      iVar5 = readDisplacement(insn_00);
      if (iVar5 == 0) {
        return 0;
      }
      return -1;
    case (InternalInstruction *)0x2:
      *(uint *)(in_RDI + 0x138) = *(int *)(in_RDI + 300) + (uint)bVar4;
      *(undefined4 *)(in_RDI + 0x13c) = 2;
      iVar5 = readDisplacement(insn_00);
      if (iVar5 == 0) {
        return 0;
      }
      return -1;
    case (InternalInstruction *)0x3:
      *(uint *)(in_RDI + 0x138) = *(int *)(in_RDI + 0x130) + (uint)bVar4;
      *(undefined4 *)(in_RDI + 0x13c) = 0;
      iVar5 = readDisplacement(insn_00);
      if (iVar5 == 0) {
        return 0;
      }
      return -1;
    default:
      return 0;
    }
  }
  if ((cVar1 != '\x04') && (cVar1 != '\b')) {
    return 0;
  }
  *(uint *)(in_RDI + 300) = (uint)(*(char *)(in_RDI + 0xf1) != '\x04') * 0x10 + 0x11;
  switch(bVar2) {
  case 0:
    *(undefined4 *)(in_RDI + 0x13c) = 0;
    if (bVar4 != 4) {
      if (bVar4 == 5) {
LAB_00350e00:
        *(undefined4 *)(in_RDI + 0x138) = 0;
        *(undefined4 *)(in_RDI + 0x13c) = 3;
        iVar5 = readDisplacement(in_stack_ffffffffffffffd8);
        if (iVar5 == 0) {
          return 0;
        }
        return -1;
      }
      if (bVar4 != 0xc) {
        if (bVar4 == 0xd) goto LAB_00350e00;
        if (bVar4 != 0x14) {
          *(uint *)(in_RDI + 0x138) = *(int *)(in_RDI + 300) + (uint)bVar4;
          return 0;
        }
      }
    }
    uVar7 = 0x25;
    if (*(char *)(in_RDI + 0xf1) == '\x04') {
      uVar7 = 0x15;
    }
    *(undefined4 *)(in_RDI + 0x138) = uVar7;
    iVar5 = readSIB((InternalInstruction *)
                    CONCAT17(bVar2,CONCAT16(bVar4,CONCAT15(bVar3,CONCAT14(in_stack_ffffffffffffffec,
                                                                          uVar6)))));
    if ((iVar5 != 0) || (iVar5 = readDisplacement(in_stack_ffffffffffffffd8), iVar5 != 0)) {
      return -1;
    }
    break;
  case 1:
    *(undefined1 *)(in_RDI + 0xf2) = 1;
  case 2:
    *(uint *)(in_RDI + 0x13c) = (bVar2 != 1) + 1 + (uint)(bVar2 != 1);
    if (((bVar4 == 4) || (bVar4 == 0xc)) || (bVar4 == 0x14)) {
      *(undefined4 *)(in_RDI + 0x138) = 0x15;
      iVar5 = readSIB((InternalInstruction *)
                      CONCAT17(bVar2,CONCAT16(bVar4,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_ffffffffffffffec,uVar6)))));
      if ((iVar5 != 0) || (iVar5 = readDisplacement(in_stack_ffffffffffffffd8), iVar5 != 0)) {
        return -1;
      }
    }
    else {
      *(uint *)(in_RDI + 0x138) = *(int *)(in_RDI + 300) + (uint)bVar4;
      iVar5 = readDisplacement(in_stack_ffffffffffffffd8);
      if (iVar5 != 0) {
        return -1;
      }
    }
    break;
  case 3:
    *(undefined4 *)(in_RDI + 0x13c) = 0;
    *(uint *)(in_RDI + 0x138) = *(int *)(in_RDI + 0x130) + (uint)bVar4;
  }
  return 0;
switchD_00350ba9_caseD_0:
  if (bVar4 != 6) {
    *(uint *)(in_RDI + 0x138) = *(int *)(in_RDI + 300) + (uint)bVar4;
    *(undefined4 *)(in_RDI + 0x13c) = 0;
    return 0;
  }
  *(undefined4 *)(in_RDI + 0x138) = 0;
  *(undefined4 *)(in_RDI + 0x13c) = 2;
  iVar5 = readDisplacement(insn_00);
  if (iVar5 == 0) {
    return 0;
  }
  return -1;
}

Assistant:

static int readModRM(struct InternalInstruction *insn)
{
	uint8_t mod, rm, reg;

	// dbgprintf(insn, "readModRM()");

	// already got ModRM byte?
	if (insn->consumedModRM)
		return 0;

	insn->modRMOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	if (consumeByte(insn, &insn->modRM))
		return -1;

	// mark that we already got ModRM
	insn->consumedModRM = true;

	// save original ModRM for later reference
	insn->orgModRM = insn->modRM;

	// handle MOVcr, MOVdr, MOVrc, MOVrd by pretending they have MRM.mod = 3
	if ((insn->firstByte == 0x0f && insn->opcodeType == TWOBYTE) &&
			(insn->opcode >= 0x20 && insn->opcode <= 0x23 ))
		insn->modRM |= 0xC0;

	mod     = modFromModRM(insn->modRM);
	rm      = rmFromModRM(insn->modRM);
	reg     = regFromModRM(insn->modRM);

	/*
	 * This goes by insn->registerSize to pick the correct register, which messes
	 * up if we're using (say) XMM or 8-bit register operands.  That gets fixed in
	 * fixupReg().
	 */
	switch (insn->registerSize) {
		case 2:
			insn->regBase = MODRM_REG_AX;
			insn->eaRegBase = EA_REG_AX;
			break;
		case 4:
			insn->regBase = MODRM_REG_EAX;
			insn->eaRegBase = EA_REG_EAX;
			break;
		case 8:
			insn->regBase = MODRM_REG_RAX;
			insn->eaRegBase = EA_REG_RAX;
			break;
	}

	reg |= rFromREX(insn->rexPrefix) << 3;
	rm  |= bFromREX(insn->rexPrefix) << 3;
	if (insn->vectorExtensionType == TYPE_EVEX) {
		reg |= r2FromEVEX2of4(insn->vectorExtensionPrefix[1]) << 4;
		rm  |=  xFromEVEX2of4(insn->vectorExtensionPrefix[1]) << 4;
	}

	insn->reg = (Reg)(insn->regBase + reg);

	switch (insn->addressSize) {
		case 2:
			insn->eaBaseBase = EA_BASE_BX_SI;

			switch (mod) {
				case 0x0:
					if (rm == 0x6) {
						insn->eaBase = EA_BASE_NONE;
						insn->eaDisplacement = EA_DISP_16;
						if (readDisplacement(insn))
							return -1;
					} else {
						insn->eaBase = (EABase)(insn->eaBaseBase + rm);
						insn->eaDisplacement = EA_DISP_NONE;
					}
					break;
				case 0x1:
					insn->eaBase = (EABase)(insn->eaBaseBase + rm);
					insn->eaDisplacement = EA_DISP_8;
					insn->displacementSize = 1;
					if (readDisplacement(insn))
						return -1;
					break;
				case 0x2:
					insn->eaBase = (EABase)(insn->eaBaseBase + rm);
					insn->eaDisplacement = EA_DISP_16;
					if (readDisplacement(insn))
						return -1;
					break;
				case 0x3:
					insn->eaBase = (EABase)(insn->eaRegBase + rm);
					insn->eaDisplacement = EA_DISP_NONE;
					if (readDisplacement(insn))
						return -1;
					break;
			}
			break;
		case 4:
		case 8:
			insn->eaBaseBase = (insn->addressSize == 4 ? EA_BASE_EAX : EA_BASE_RAX);

			switch (mod) {
				case 0x0:
					insn->eaDisplacement = EA_DISP_NONE; /* readSIB may override this */
					switch (rm) {
						case 0x14:
						case 0x4:
						case 0xc:   /* in case REXW.b is set */
							insn->eaBase = (insn->addressSize == 4 ?
									EA_BASE_sib : EA_BASE_sib64);
							if (readSIB(insn) || readDisplacement(insn))
								return -1;
							break;
						case 0x5:
						case 0xd:
							insn->eaBase = EA_BASE_NONE;
							insn->eaDisplacement = EA_DISP_32;
							if (readDisplacement(insn))
								return -1;
							break;
						default:
							insn->eaBase = (EABase)(insn->eaBaseBase + rm);
							break;
					}

					break;
				case 0x1:
					insn->displacementSize = 1;
					/* FALLTHROUGH */
				case 0x2:
					insn->eaDisplacement = (mod == 0x1 ? EA_DISP_8 : EA_DISP_32);
					switch (rm) {
						case 0x14:
						case 0x4:
						case 0xc:   /* in case REXW.b is set */
							insn->eaBase = EA_BASE_sib;
							if (readSIB(insn) || readDisplacement(insn))
								return -1;
							break;
						default:
							insn->eaBase = (EABase)(insn->eaBaseBase + rm);
							if (readDisplacement(insn))
								return -1;
							break;
					}
					break;
				case 0x3:
					insn->eaDisplacement = EA_DISP_NONE;
					insn->eaBase = (EABase)(insn->eaRegBase + rm);
					break;
			}
			break;
	} /* switch (insn->addressSize) */

	return 0;
}